

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::solve(Matrix *this,Matrix *A,Matrix *b)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  ulong uVar6;
  domain_error *this_00;
  long lVar7;
  uint uVar8;
  double **ppdVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double **ppdVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  Matrix MVar19;
  
  uVar11 = (ulong)(uint)A->rows_;
  if (0 < A->rows_) {
    uVar6 = 1;
    lVar12 = 0;
    do {
      ppdVar1 = A->p;
      pdVar2 = ppdVar1[lVar12];
      if ((pdVar2[lVar12] == 0.0) && (!NAN(pdVar2[lVar12]))) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again."
                  );
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      lVar7 = lVar12 + 1;
      lVar13 = (long)(int)uVar11;
      if (lVar7 < lVar13) {
        iVar16 = A->cols_;
        uVar14 = uVar6;
        do {
          uVar17 = uVar6;
          if (lVar7 < iVar16) {
            do {
              pdVar3 = ppdVar1[uVar14];
              dVar18 = pdVar3[uVar17] - (pdVar3[lVar12] / pdVar2[lVar12]) * pdVar2[uVar17];
              pdVar3[uVar17] = (double)(~-(ulong)(ABS(dVar18) < 1e-10) & (ulong)dVar18);
              uVar17 = uVar17 + 1;
              iVar16 = A->cols_;
            } while ((int)uVar17 < iVar16);
          }
          pdVar3 = ppdVar1[uVar14];
          pdVar4 = b->p[uVar14];
          *pdVar4 = *pdVar4 - (pdVar3[lVar12] / pdVar2[lVar12]) * *b->p[lVar12];
          if (ABS(*pdVar3) < 1e-10) {
            *pdVar3 = 0.0;
          }
          pdVar3[lVar12] = 0.0;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar11);
        uVar11 = (ulong)(uint)A->rows_;
        lVar13 = (long)A->rows_;
      }
      uVar6 = uVar6 + 1;
      lVar12 = lVar7;
    } while (lVar7 < lVar13);
  }
  Matrix(this,b->rows_,1);
  iVar16 = this->rows_;
  uVar8 = iVar16 - 1;
  ppdVar9 = (double **)(ulong)uVar8;
  dVar18 = *b->p[(int)uVar8] / A->p[(int)uVar8][(int)uVar8];
  ppdVar1 = this->p;
  *ppdVar1[(int)uVar8] = (double)(~-(ulong)(ABS(dVar18) < 1e-10) & (ulong)dVar18);
  if (1 < (long)iVar16) {
    ppdVar9 = (double **)(ulong)uVar8;
    lVar12 = (long)ppdVar9 * 8;
    ppdVar15 = ppdVar1 + (long)ppdVar9;
    uVar11 = (ulong)(iVar16 - 2);
    do {
      dVar18 = 0.0;
      if ((long)uVar11 < (long)iVar16 + -1) {
        lVar7 = 0;
        iVar10 = 0;
        do {
          iVar10 = (int)(*(double *)((long)A->p[uVar11] + lVar7 * 8 + lVar12) * *ppdVar15[lVar7] +
                        (double)iVar10);
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 + (int)ppdVar9 < iVar16);
        dVar18 = (double)iVar10;
      }
      dVar18 = (*b->p[uVar11] - dVar18) / A->p[uVar11][uVar11];
      *ppdVar1[uVar11] = (double)(~-(ulong)(ABS(dVar18) < 1e-10) & (ulong)dVar18);
      ppdVar9 = (double **)((long)ppdVar9 - 1);
      ppdVar15 = ppdVar15 + -1;
      lVar12 = lVar12 + -8;
      bVar5 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar5);
  }
  MVar19.p = ppdVar9;
  MVar19._0_8_ = this;
  return MVar19;
}

Assistant:

Matrix Matrix::solve(Matrix A, Matrix b)
{
    // Gaussian elimination
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw error
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_; ++j) {
            for (int k = i + 1; k < A.cols_; ++k) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                if (A.p[j][k] < EPS && A.p[j][k] > -1*EPS)
                    A.p[j][k] = 0;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            if (A.p[j][0] < EPS && A.p[j][0] > -1*EPS)
                A.p[j][0] = 0;
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    if (x.p[x.rows_ - 1][0] < EPS && x.p[x.rows_ - 1][0] > -1*EPS)
        x.p[x.rows_ - 1][0] = 0;
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
        if (x.p[i][0] < EPS && x.p[i][0] > -1*EPS)
            x.p[i][0] = 0;
    }

    return x;
}